

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::skipgram
          (FastText *this,Model *model,real lr,vector<int,_std::allocator<int>_> *line)

{
  result_type rVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  vector<int,_std::allocator<int>_> *in_RDX;
  Dictionary *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int32_t c;
  vector<int,_std::allocator<int>_> *ngrams;
  int32_t boundary;
  int32_t w;
  uniform_int_distribution<int> uniform;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Dictionary *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 local_2c;
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1393c8);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             in_stack_ffffffffffffff88);
  local_2c = 0;
  while( true ) {
    uVar4 = (ulong)local_2c;
    sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (sVar5 <= uVar4) break;
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_ffffffffffffff90,
                       (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x139432);
    std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_2c);
    Dictionary::getNgrams(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    for (iVar3 = -rVar1; iVar3 <= rVar1; iVar3 = iVar3 + 1) {
      if ((iVar3 != 0) && (-1 < local_2c + iVar3)) {
        iVar2 = local_2c + iVar3;
        sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
        if ((ulong)(long)iVar2 < sVar5) {
          in_stack_ffffffffffffff90 = in_RSI;
          std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(local_2c + iVar3));
          Model::update((Model *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),in_RDI,
                        (int32_t)(uVar4 >> 0x20),(real)uVar4);
        }
      }
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void FastText::skipgram(Model& model, real lr,
                        const std::vector<int32_t>& line) {
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(model.rng);
    const std::vector<int32_t>& ngrams = dict_->getNgrams(line[w]);
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        model.update(ngrams, line[w + c], lr);
      }
    }
  }
}